

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_sseq.c
# Opt level: O0

uint32 * mk_sseq(uint16 *seg,uint32 n_frame,acmod_id_t *phone,uint32 n_phone,model_def_t *mdef)

{
  uint32 *puVar1;
  ushort local_52;
  uint16 seg_val;
  uint32 n_state;
  uint32 s;
  model_def_entry_t *defn;
  uint32 p;
  uint32 f;
  uint32 *sseq;
  model_def_t *mdef_local;
  uint32 n_phone_local;
  acmod_id_t *phone_local;
  uint32 n_frame_local;
  uint16 *seg_local;
  
  _n_state = (model_def_entry_t *)0x0;
  puVar1 = (uint32 *)
           __ckd_calloc__((ulong)n_frame,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_sseq.c"
                          ,0x45);
  defn._0_4_ = 0xffffffff;
  defn._4_4_ = 0;
  do {
    if (n_frame <= defn._4_4_) {
      return puVar1;
    }
    local_52 = seg[defn._4_4_];
    if ((local_52 & 0x8000) != 0) {
      defn._0_4_ = (uint)defn + 1;
      if (n_phone <= (uint)defn) {
        __assert_fail("p < n_phone",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_sseq.c"
                      ,0x52,"uint32 *mk_sseq(uint16 *, uint32, acmod_id_t *, uint32, model_def_t *)"
                     );
      }
      _n_state = mdef->defn + phone[(uint)defn];
      local_52 = local_52 & 0x7fff;
    }
    puVar1[defn._4_4_] = _n_state->state[(uint)local_52 % 0x13];
    defn._4_4_ = defn._4_4_ + 1;
  } while( true );
}

Assistant:

uint32 *
mk_sseq(uint16 *seg,
	uint32 n_frame,
	acmod_id_t *phone,
	uint32 n_phone,
	model_def_t *mdef)
{
    uint32 *sseq;
    uint32 f;
    uint32 p;
    model_def_entry_t *defn = NULL;
    uint32 s;
    uint32 n_state = MAX_N_STATE-1;	/* BEWARE: this should not stay */
    uint16 seg_val;

    sseq = ckd_calloc(n_frame, sizeof(uint32));

    p = 0;
    --p;

    for (f = 0; f < n_frame; f++) {
	seg_val = seg[f];

	if (seg_val & 0x8000) {
	    /* reached a phone begin marker */

	    ++p;	/* next phone */

	    assert(p < n_phone);

	    defn = &mdef->defn[phone[p]];

	    seg_val &= 0x7fff;	/* clr phone begin bit */
	}

	s = seg_val % n_state;	/* model state [0..N-1] where N is # of states/model */

	sseq[f] = defn->state[s];
    }

    return sseq;
}